

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.hh
# Opt level: O3

void __thiscall
dtc::fdt::checking::property_type_checker<(dtc::fdt::property_value::value_type)0>::
~property_type_checker(property_type_checker<(dtc::fdt::property_value::value_type)0> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_property_checker).super_checker._vptr_checker =
       (_func_int **)&PTR__property_checker_00147ef8;
  pcVar2 = (this->super_property_checker).key._M_dataplus._M_p;
  paVar1 = &(this->super_property_checker).key.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_property_checker).super_checker._vptr_checker = (_func_int **)&PTR__checker_00148038;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&(this->super_property_checker).super_checker.path.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           );
  operator_delete(this,0x48);
  return;
}

Assistant:

property_type_checker(const char* name, const std::string &property_name) :
		property_checker(name, property_name) {}